

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xreq_test.c
# Opt level: O3

void test_xreq_close_pipe_during_send(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  uint32_t v;
  nng_msg *local_48;
  nng_msg *m;
  nng_pipe p2;
  nng_pipe p1;
  nng_socket rep;
  nng_socket req;
  
  nVar1 = nng_rep0_open_raw((nng_socket *)&p2);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0x141,"%s: expected success, got %s (%d)","nng_rep0_open_raw(&rep)",pcVar3
                         ,nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_req0_open_raw((nng_socket *)&p1);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                           ,0x142,"%s: expected success, got %s (%d)","nng_req0_open_raw(&req)",
                           pcVar3,nVar1);
    if (iVar2 != 0) {
      nVar1 = nng_socket_set_ms((nng_socket)p2.id,"recv-timeout",1000);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                             ,0x143,"%s: expected success, got %s (%d)",
                             "nng_socket_set_ms(rep, NNG_OPT_RECVTIMEO, 1000)",pcVar3,nVar1);
      if (iVar2 != 0) {
        nVar1 = nng_socket_set_ms((nng_socket)p1.id,"send-timeout",100);
        pcVar3 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                               ,0x144,"%s: expected success, got %s (%d)",
                               "nng_socket_set_ms(req, NNG_OPT_SENDTIMEO, 100)",pcVar3,nVar1);
        if (iVar2 != 0) {
          nVar1 = nng_socket_set_int((nng_socket)p2.id,"recv-buffer",5);
          pcVar3 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                 ,0x145,"%s: expected success, got %s (%d)",
                                 "nng_socket_set_int(rep, NNG_OPT_RECVBUF, 5)",pcVar3,nVar1);
          if (iVar2 != 0) {
            nVar1 = nng_socket_set_int((nng_socket)p1.id,"send-buffer",0x14);
            pcVar3 = nng_strerror(nVar1);
            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                   ,0x146,"%s: expected success, got %s (%d)",
                                   "nng_socket_set_int(req, NNG_OPT_SENDBUF, 20)",pcVar3,nVar1);
            if (iVar2 != 0) {
              nVar1 = nuts_marry_ex((nng_socket)p1.id,(nng_socket)p2.id,(char *)0x0,
                                    (nng_pipe *)((long)&m + 4),(nng_pipe *)&m);
              pcVar3 = nng_strerror(nVar1);
              iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                     ,0x148,"%s: expected success, got %s (%d)",
                                     "nuts_marry_ex(req, rep, ((void*)0), &p1, &p2)",pcVar3,nVar1);
              if (iVar2 != 0) {
                iVar2 = nng_pipe_id(m._4_4_);
                acutest_check_((uint)(0 < iVar2),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                               ,0x149,"%s","nng_pipe_id(p1) > 0");
                iVar2 = nng_pipe_id(m._0_4_);
                acutest_check_((uint)(0 < iVar2),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                               ,0x14a,"%s","nng_pipe_id(p2) > 0");
                v = 0x80000000;
                do {
                  nVar1 = nng_msg_alloc(&local_48,4);
                  pcVar3 = nng_strerror(nVar1);
                  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                         ,0x14d,"%s: expected success, got %s (%d)",
                                         "nng_msg_alloc(&m, 4)",pcVar3,nVar1);
                  if (iVar2 == 0) goto LAB_0010e4b9;
                  nVar1 = nng_msg_header_append_u32(local_48,v);
                  pcVar3 = nng_strerror(nVar1);
                  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                         ,0x14e,"%s: expected success, got %s (%d)",
                                         "nng_msg_header_append_u32(m, i | 0x80000000u)",pcVar3,
                                         nVar1);
                  if (iVar2 == 0) goto LAB_0010e4b9;
                  nuts_sleep(10);
                  nVar1 = nng_sendmsg((nng_socket)p1.id,local_48,0);
                  pcVar3 = nng_strerror(nVar1);
                  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                         ,0x150,"%s: expected success, got %s (%d)",
                                         "nng_sendmsg(req, m, 0)",pcVar3,nVar1);
                  if (iVar2 == 0) goto LAB_0010e4b9;
                  v = v + 1;
                } while (v != 0x80000014);
                nVar1 = nng_pipe_close(m._4_4_);
                pcVar3 = nng_strerror(nVar1);
                iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                       ,0x153,"%s: expected success, got %s (%d)",
                                       "nng_pipe_close(p1)",pcVar3,nVar1);
                if (iVar2 != 0) {
                  nVar1 = nng_socket_close((nng_socket)p1.id);
                  pcVar3 = nng_strerror(nVar1);
                  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                         ,0x154,"%s: expected success, got %s (%d)",
                                         "nng_socket_close(req)",pcVar3,nVar1);
                  if (iVar2 != 0) {
                    nVar1 = nng_socket_close((nng_socket)p2.id);
                    pcVar3 = nng_strerror(nVar1);
                    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                           ,0x155,"%s: expected success, got %s (%d)",
                                           "nng_socket_close(rep)",pcVar3,nVar1);
                    if (iVar2 != 0) {
                      return;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0010e4b9:
  acutest_abort_();
}

Assistant:

static void
test_xreq_close_pipe_during_send(void)
{
	nng_socket rep;
	nng_socket req;
	nng_msg   *m;
	nng_pipe   p1;
	nng_pipe   p2;

	NUTS_PASS(nng_rep0_open_raw(&rep));
	NUTS_PASS(nng_req0_open_raw(&req));
	NUTS_PASS(nng_socket_set_ms(rep, NNG_OPT_RECVTIMEO, 1000));
	NUTS_PASS(nng_socket_set_ms(req, NNG_OPT_SENDTIMEO, 100));
	NUTS_PASS(nng_socket_set_int(rep, NNG_OPT_RECVBUF, 5));
	NUTS_PASS(nng_socket_set_int(req, NNG_OPT_SENDBUF, 20));

	NUTS_MARRY_EX(req, rep, NULL, &p1, &p2);
	NUTS_TRUE(nng_pipe_id(p1) > 0);
	NUTS_TRUE(nng_pipe_id(p2) > 0);

	for (unsigned i = 0; i < 20; i++) {
		NUTS_PASS(nng_msg_alloc(&m, 4));
		NUTS_PASS(nng_msg_header_append_u32(m, i | 0x80000000u));
		NUTS_SLEEP(10);
		NUTS_PASS(nng_sendmsg(req, m, 0));
	}

	NUTS_PASS(nng_pipe_close(p1));
	NUTS_CLOSE(req);
	NUTS_CLOSE(rep);
}